

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O2

char duckdb::AddOperatorOverflowCheck::Operation<signed_char,signed_char,signed_char>
               (char left,char right)

{
  char cVar1;
  int iVar2;
  OutOfRangeException *this;
  PhysicalType type;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar2 = (int)CONCAT71(in_register_00000031,right) + (int)CONCAT71(in_register_00000039,left);
  cVar1 = (char)iVar2;
  if ((short)cVar1 == (short)iVar2) {
    return cVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Overflow in addition of %s (%s + %s)!",&local_a1);
  TypeIdToString_abi_cxx11_(&local_60,(duckdb *)0x3,type);
  NumericHelper::ToString<signed_char>(&local_80,left);
  NumericHelper::ToString<signed_char>(&local_a0,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_40,&local_60,&local_80,&local_a0);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}